

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfigReader.h
# Opt level: O2

void ParseToken(config_params *cfp,string *key,string *val)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  double dVar4;
  double local_1e0;
  string token;
  stringstream is_val;
  
  bVar1 = std::operator==(key,"input_files");
  if (bVar1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&is_val,(string *)val,_S_out|_S_in);
    token._M_dataplus._M_p = (pointer)&token.field_2;
    token._M_string_length = 0;
    token.field_2._M_local_buf[0] = '\0';
    while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&is_val,(string *)&token,','),
          ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)cfp,&token);
    }
  }
  else {
    bVar1 = std::operator==(key,"triangle_count");
    if (bVar1) {
      std::__cxx11::stringstream::stringstream((stringstream *)&is_val,(string *)val,_S_out|_S_in);
      token._M_dataplus._M_p = (pointer)&token.field_2;
      token._M_string_length = 0;
      token.field_2._M_local_buf[0] = '\0';
      while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&is_val,(string *)&token,','),
            ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
        local_1e0 = std::__cxx11::stod(&token,(size_t *)0x0);
        std::vector<long_long,_std::allocator<long_long>_>::emplace_back<double>
                  (&cfp->triangle_count,&local_1e0);
      }
    }
    else {
      bVar1 = std::operator==(key,"no_of_repeats");
      if (bVar1) {
        iVar2 = std::__cxx11::stoi(val,(size_t *)0x0,10);
        cfp->no_of_repeats = iVar2;
        return;
      }
      bVar1 = std::operator==(key,"sparsification_prob");
      if (bVar1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&is_val,(string *)val,_S_out|_S_in)
        ;
        token._M_dataplus._M_p = (pointer)&token.field_2;
        token._M_string_length = 0;
        token.field_2._M_local_buf[0] = '\0';
        while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                  ((istream *)&is_val,(string *)&token,','),
              ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
          local_1e0 = std::__cxx11::stod(&token,(size_t *)0x0);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (&cfp->sparsification_prob,&local_1e0);
        }
      }
      else {
        bVar1 = std::operator==(key,"subsample_prob");
        if (bVar1) {
          dVar4 = std::__cxx11::stod(val,(size_t *)0x0);
          cfp->subsample_prob = dVar4;
          return;
        }
        bVar1 = std::operator==(key,"seed_count");
        if (bVar1) {
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)&is_val,(string *)val,_S_out|_S_in);
          token._M_dataplus._M_p = (pointer)&token.field_2;
          token._M_string_length = 0;
          token.field_2._M_local_buf[0] = '\0';
          while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)&is_val,(string *)&token,','),
                ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
            iVar2 = std::__cxx11::stoi(&token,(size_t *)0x0,10);
            local_1e0 = (double)CONCAT44(local_1e0._4_4_,iVar2);
            std::vector<int,_std::allocator<int>_>::emplace_back<int>
                      (&cfp->seed_count,(int *)&local_1e0);
          }
        }
        else {
          bVar1 = std::operator==(key,"algo_names");
          if (!bVar1) {
            bVar1 = std::operator==(key,"out_directory");
            if (bVar1) {
              std::__cxx11::string::_M_assign((string *)&cfp->out_directory);
              return;
            }
            bVar1 = std::operator==(key,"print_to_console");
            if (bVar1) {
              bVar1 = std::operator==(val,"true");
              if (bVar1) {
                cfp->print_to_console = true;
                return;
              }
              bVar1 = std::operator==(val,"false");
              if (bVar1) {
                cfp->print_to_console = false;
                return;
              }
            }
            else {
              bVar1 = std::operator==(key,"print_to_file");
              if (bVar1) {
                bVar1 = std::operator==(val,"true");
                if (bVar1) {
                  cfp->print_to_file = true;
                  return;
                }
                bVar1 = std::operator==(val,"false");
                if (bVar1) {
                  cfp->print_to_file = false;
                  return;
                }
              }
              else {
                bVar1 = std::operator==(key,"normalization_count_available");
                if (bVar1) {
                  bVar1 = std::operator==(val,"true");
                  if (bVar1) {
                    cfp->edge_count_available = true;
                    return;
                  }
                  bVar1 = std::operator==(val,"false");
                  if (bVar1) {
                    cfp->edge_count_available = false;
                    return;
                  }
                }
                else {
                  bVar1 = std::operator==(key,"CSS");
                  if (bVar1) {
                    bVar1 = std::operator==(val,"true");
                    if (bVar1) {
                      cfp->CSS = true;
                      return;
                    }
                    bVar1 = std::operator==(val,"false");
                    if (bVar1) {
                      cfp->CSS = false;
                      return;
                    }
                  }
                  else {
                    bVar1 = std::operator==(key,"NB");
                    if (bVar1) {
                      bVar1 = std::operator==(val,"true");
                      if (bVar1) {
                        cfp->NB = true;
                        return;
                      }
                      bVar1 = std::operator==(val,"false");
                      if (bVar1) {
                        cfp->NB = false;
                        return;
                      }
                    }
                    else {
                      bVar1 = std::operator==(key,"degree_bin_seed");
                      if (bVar1) {
                        bVar1 = std::operator==(val,"true");
                        if (bVar1) {
                          cfp->degree_bin_seed = true;
                          return;
                        }
                        bVar1 = std::operator==(val,"false");
                        if (bVar1) {
                          cfp->degree_bin_seed = false;
                          return;
                        }
                      }
                    }
                  }
                }
              }
            }
            std::operator<<((ostream *)&std::cout,"Unknow token encountered \n");
            return;
          }
          std::__cxx11::stringstream::stringstream
                    ((stringstream *)&is_val,(string *)val,_S_out|_S_in);
          token._M_dataplus._M_p = (pointer)&token.field_2;
          token._M_string_length = 0;
          token.field_2._M_local_buf[0] = '\0';
          while (piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                    ((istream *)&is_val,(string *)&token,','),
                ((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) == 0) {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &cfp->algo_names,&token);
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&token);
  std::__cxx11::stringstream::~stringstream((stringstream *)&is_val);
  return;
}

Assistant:

void ParseToken(config_params& cfp, string key, string val) {

    if (key == "input_files") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.input_files.emplace_back(token);
    }

    else if (key == "triangle_count") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.triangle_count.emplace_back(stod(token));
    }

    else if (key == "no_of_repeats")
        cfp.no_of_repeats = stoi(val, nullptr,10);

    else if (key == "sparsification_prob") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.sparsification_prob.emplace_back(stod(token));
    }

    else if (key == "subsample_prob")
        cfp.subsample_prob = stod(val);

    else if ( key == "seed_count") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.seed_count.emplace_back(stoi(token));
    }

    else if (key == "algo_names") {
        stringstream is_val (val);
        string token;
        while (getline(is_val,token,','))
            cfp.algo_names.emplace_back(token);
    }

    else if (key == "out_directory") {
        cfp.out_directory = val;
    }

    else if (key == "print_to_console") {
        if (val == "true")
            cfp.print_to_console = true;
        else if (val == "false")
            cfp.print_to_console = false;
        else
            std::cout << "Unknow token encountered \n";
    }
    else if (key == "print_to_file") {
        if (val == "true")
            cfp.print_to_file = true;
        else if (val == "false")
            cfp.print_to_file = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }

    else if (key == "normalization_count_available") {
        if (val == "true")
            cfp.edge_count_available = true;
        else if (val == "false")
            cfp.edge_count_available = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }
    else if (key == "CSS") {
        if (val == "true")
            cfp.CSS = true;
        else if (val == "false")
            cfp.CSS = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }
    else if (key == "NB") {
        if (val == "true")
            cfp.NB = true;
        else if (val == "false")
            cfp.NB = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }

    else if (key == "degree_bin_seed") {
        if (val == "true")
            cfp.degree_bin_seed = true;
        else if (val == "false")
            cfp.degree_bin_seed = false;
        else {
            std::cout << "Unknow token encountered \n" ;
        }
    }

    else
        std::cout << "Unknow token encountered \n" ;
}